

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprCacheRemove(Parse *pParse,int iReg,int nReg)

{
  int iVar1;
  yColCache *p;
  bool bVar2;
  
  p = pParse->aColCache;
  iVar1 = 10;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    if (p->iReg < nReg + iReg && iReg <= p->iReg) {
      cacheEntryClear(pParse,p);
      p->iReg = 0;
    }
    p = p + 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCacheRemove(Parse *pParse, int iReg, int nReg){
  int i;
  int iLast = iReg + nReg - 1;
  struct yColCache *p;
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    int r = p->iReg;
    if( r>=iReg && r<=iLast ){
      cacheEntryClear(pParse, p);
      p->iReg = 0;
    }
  }
}